

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

Logs * __thiscall
deqp::gles3::Performance::InvalidShaderCompilerCase::getLogs
          (Logs *__return_storage_ptr__,InvalidShaderCompilerCase *this,Shaders *shaders)

{
  int iVar1;
  undefined4 extraout_var;
  deUint32 shader;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_40;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (__return_storage_ptr__->vert)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->vert).field_2
  ;
  (__return_storage_ptr__->vert)._M_string_length = 0;
  (__return_storage_ptr__->vert).field_2._M_local_buf[0] = '\0';
  paVar2 = &(__return_storage_ptr__->frag).field_2;
  (__return_storage_ptr__->frag)._M_dataplus._M_p = (pointer)paVar2;
  (__return_storage_ptr__->frag)._M_string_length = 0;
  (__return_storage_ptr__->frag).field_2._M_local_buf[0] = '\0';
  getShaderInfoLog_abi_cxx11_
            (&local_40,(Performance *)CONCAT44(extraout_var,iVar1),
             (Functions *)(ulong)shaders->vertShader,(deUint32)paVar2);
  shader = (deUint32)paVar2;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  getShaderInfoLog_abi_cxx11_
            (&local_40,(Performance *)CONCAT44(extraout_var,iVar1),
             (Functions *)(ulong)shaders->fragShader,shader);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->frag,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

InvalidShaderCompilerCase::Logs InvalidShaderCompilerCase::getLogs (const Shaders& shaders) const
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	Logs					result;

	result.vert = getShaderInfoLog(gl, shaders.vertShader);
	result.frag = getShaderInfoLog(gl, shaders.fragShader);

	return result;
}